

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O2

void anon_unknown.dwarf_e7a7b8::clipLine<((anonymous_namespace)::Edge)2>
               (QPointF *a,QPointF *b,qreal t,QPainterPath *result)

{
  long in_FS_OFFSET;
  QPointF QVar1;
  QLineF local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((a->xp <= t) || (b->xp <= t)) {
    if (t < a->xp) {
      QVar1 = intersectLine<((anonymous_namespace)::Edge)2>(a,b,t);
      local_48.pt1.yp = QVar1.yp;
      local_48.pt1.xp = QVar1.xp;
      local_48.pt2.xp = b->xp;
      local_48.pt2.yp = b->yp;
    }
    else if (t < b->xp) {
      QVar1 = intersectLine<((anonymous_namespace)::Edge)2>(a,b,t);
      local_48.pt2.yp = QVar1.yp;
      local_48.pt1.xp = a->xp;
      local_48.pt1.yp = a->yp;
      local_48.pt2.xp = QVar1.xp;
    }
    else {
      local_48.pt1.xp = a->xp;
      local_48.pt1.yp = a->yp;
      local_48.pt2.xp = b->xp;
      local_48.pt2.yp = b->yp;
    }
    addLine(result,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clipLine(const QPointF &a, const QPointF &b, qreal t, QPainterPath &result)
{
    bool outA = compare<edge>(a, t);
    bool outB = compare<edge>(b, t);
    if (outA && outB)
        return;

    if (outA)
        addLine(result, QLineF(intersectLine<edge>(a, b, t), b));
    else if (outB)
        addLine(result, QLineF(a, intersectLine<edge>(a, b, t)));
    else
        addLine(result, QLineF(a, b));
}